

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

int Ree_ManCountFadds(Vec_Int_t *vAdds)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = vAdds->nSize;
  iVar2 = 0;
  if (0 < iVar1) {
    uVar3 = 2;
    do {
      if (iVar1 <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (iVar2 + 1) - (uint)(vAdds->pArray[uVar3] == 0);
      iVar4 = uVar3 + 4;
      uVar3 = uVar3 + 6;
    } while (iVar4 < iVar1);
  }
  return iVar2;
}

Assistant:

int Ree_ManCountFadds( Vec_Int_t * vAdds )
{
    int i, Count = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vAdds, 6*i+2) != 0 )
            Count++;
    return Count;
}